

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

void __thiscall o3dgc::BinaryStream::WriteFloat32Bin(BinaryStream *this,float value)

{
  uchar *ptr;
  BinaryStream *pBStack_10;
  float value_local;
  BinaryStream *this_local;
  
  ptr._4_4_ = value;
  pBStack_10 = this;
  if (this->m_endianness == O3DGC_BIG_ENDIAN) {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 7));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 6));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 5));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 4));
  }
  else {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 4));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 5));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 6));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 7));
  }
  return;
}

Assistant:

void                    WriteFloat32Bin(float value) 
                                {
                                    unsigned char * ptr = (unsigned char *) (&value);
                                    if (m_endianness == O3DGC_BIG_ENDIAN)
                                    {
                                        m_stream.PushBack(ptr[3]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[0]);
                                    }
                                    else
                                    {
                                        m_stream.PushBack(ptr[0]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[3]);
                                    }
                                }